

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::TestCase::Run(TestCase *this)

{
  TestEventRepeater *pTVar1;
  pointer piVar2;
  UnitTestImpl *pUVar3;
  OsStackTraceGetterInterface *pOVar4;
  pointer ppTVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  undefined1 local_48 [8];
  timeval now;
  
  if (this->should_run_ == true) {
    UnitTest::GetInstance();
    pUVar3 = UnitTest::GetInstance::instance.impl_;
    (UnitTest::GetInstance::instance.impl_)->current_test_case_ = this;
    UnitTest::GetInstance();
    pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[6])(pTVar1,this);
    if (pUVar3->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
      pOVar4 = (OsStackTraceGetterInterface *)operator_new(8);
      pOVar4->_vptr_OsStackTraceGetterInterface =
           (_func_int **)&PTR__OsStackTraceGetterInterface_0014b6c8;
      pUVar3->os_stack_trace_getter_ = pOVar4;
    }
    (*pUVar3->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface[3])();
    internal::HandleExceptionsInMethodIfSupported<testing::TestCase,void>(this,0x1351e0,(char *)0x0)
    ;
    gettimeofday((timeval *)local_48,(__timezone_ptr_t)0x0);
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(now.tv_sec),8);
    now.tv_usec = (__suseconds_t)local_48;
    ppTVar5 = (this->test_info_list_).
              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->test_info_list_).
                                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5) >> 3)) {
      lVar8 = 0;
      do {
        piVar2 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = 0xffffffff;
        if (lVar8 < (int)((ulong)((long)(this->test_indices_).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar2) >> 2)) {
          uVar6 = piVar2[lVar8];
        }
        TestInfo::Run(ppTVar5[uVar6]);
        lVar8 = lVar8 + 1;
        ppTVar5 = (this->test_info_list_).
                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (lVar8 < (int)((ulong)((long)(this->test_info_list_).
                                           super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppTVar5) >> 3));
    }
    gettimeofday((timeval *)local_48,(__timezone_ptr_t)0x0);
    this->elapsed_time_ =
         ((long)local_48 - now.tv_usec) * 1000 +
         now.tv_sec / 1000 + ((lVar7 >> 7) - (lVar7 >> 0x3f));
    if (pUVar3->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
      pOVar4 = (OsStackTraceGetterInterface *)operator_new(8);
      pOVar4->_vptr_OsStackTraceGetterInterface =
           (_func_int **)&PTR__OsStackTraceGetterInterface_0014b6c8;
      pUVar3->os_stack_trace_getter_ = pOVar4;
    }
    (*pUVar3->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface[3])();
    internal::HandleExceptionsInMethodIfSupported<testing::TestCase,void>(this,0x1351e8,(char *)0x0)
    ;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[10])(pTVar1,this);
    pUVar3->current_test_case_ = (TestCase *)0x0;
  }
  return;
}

Assistant:

void TestCase::Run() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_case(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  repeater->OnTestCaseStart(*this);
  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestCase::RunSetUpTestCase, "SetUpTestCase()");

  const internal::TimeInMillis start = internal::GetTimeInMillis();
  for (int i = 0; i < total_test_count(); i++) {
    GetMutableTestInfo(i)->Run();
  }
  elapsed_time_ = internal::GetTimeInMillis() - start;

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestCase::RunTearDownTestCase, "TearDownTestCase()");

  repeater->OnTestCaseEnd(*this);
  impl->set_current_test_case(NULL);
}